

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

int mbedtls_mpi_inv_mod(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *N)

{
  byte *pbVar1;
  mbedtls_mpi *X_00;
  int iVar2;
  int iVar3;
  size_t sVar4;
  mbedtls_mpi_uint *pmVar5;
  mbedtls_mpi *B;
  mbedtls_mpi *X_01;
  mbedtls_mpi TU;
  mbedtls_mpi V1;
  mbedtls_mpi TV;
  mbedtls_mpi U2;
  mbedtls_mpi U1;
  mbedtls_mpi Y;
  mbedtls_mpi TA;
  mbedtls_mpi_uint p_1 [1];
  mbedtls_mpi V2;
  mbedtls_mpi TB;
  mbedtls_mpi G;
  mbedtls_mpi local_128;
  mbedtls_mpi local_110;
  mbedtls_mpi local_f8;
  mbedtls_mpi local_e0;
  mbedtls_mpi local_c8;
  mbedtls_mpi local_b0;
  mbedtls_mpi local_98;
  undefined1 local_80 [16];
  mbedtls_mpi_uint *local_70;
  byte *pbStack_68;
  mbedtls_mpi local_60;
  mbedtls_mpi local_48;
  
  local_b0.p = (mbedtls_mpi_uint *)&local_48;
  local_48.s = 1;
  local_48._4_4_ = 0;
  local_b0.s = 1;
  local_b0.n = 1;
  iVar2 = mbedtls_mpi_cmp_mpi(N,&local_b0);
  if (iVar2 < 1) {
    return -4;
  }
  local_98.s = 1;
  local_98.n = 0;
  local_98.p = (mbedtls_mpi_uint *)0x0;
  local_128.s = 1;
  local_128.n = 0;
  local_128.p = (mbedtls_mpi_uint *)0x0;
  local_c8.s = 1;
  local_c8.n = 0;
  local_c8.p = (mbedtls_mpi_uint *)0x0;
  local_e0.s = 1;
  local_e0.n = 0;
  local_e0.p = (mbedtls_mpi_uint *)0x0;
  local_48.s = 1;
  local_48.n = 0;
  local_48.p = (mbedtls_mpi_uint *)0x0;
  local_60.s = 1;
  local_60.n = 0;
  local_60.p = (mbedtls_mpi_uint *)0x0;
  local_f8.s = 1;
  local_f8.n = 0;
  local_f8.p = (mbedtls_mpi_uint *)0x0;
  local_110.s = 1;
  local_110.n = 0;
  local_110.p = (mbedtls_mpi_uint *)0x0;
  local_80._8_4_ = 1;
  local_70 = (mbedtls_mpi_uint *)0x0;
  pbStack_68 = (byte *)0x0;
  iVar2 = mbedtls_mpi_gcd(&local_48,A,N);
  if (iVar2 == 0) {
    local_80._0_8_ = 1;
    local_b0.s = 1;
    local_b0.n = 1;
    local_b0.p = (mbedtls_mpi_uint *)local_80;
    iVar3 = mbedtls_mpi_cmp_mpi(&local_48,&local_b0);
    iVar2 = -0xe;
    if ((((((iVar3 == 0) && (iVar2 = mbedtls_mpi_mod_mpi(&local_98,A,N), iVar2 == 0)) &&
          (iVar2 = mbedtls_mpi_copy(&local_128,&local_98), iVar2 == 0)) &&
         ((iVar2 = mbedtls_mpi_copy(&local_60,N), iVar2 == 0 &&
          (iVar2 = mbedtls_mpi_copy(&local_f8,N), iVar2 == 0)))) &&
        ((iVar2 = mbedtls_mpi_lset(&local_c8,1), iVar2 == 0 &&
         ((iVar2 = mbedtls_mpi_lset(&local_e0,0), iVar2 == 0 &&
          (iVar2 = mbedtls_mpi_lset(&local_110,0), iVar2 == 0)))))) &&
       (iVar2 = mbedtls_mpi_lset((mbedtls_mpi *)(local_80 + 8),1), iVar2 == 0)) {
      X_00 = (mbedtls_mpi *)(local_80 + 8);
      do {
        while ((*local_128.p & 1) == 0) {
          iVar2 = mbedtls_mpi_shift_r(&local_128,1);
          if (((iVar2 != 0) ||
              ((((*local_c8.p & 1) != 0 || ((*local_e0.p & 1) != 0)) &&
               ((iVar2 = mbedtls_mpi_add_mpi(&local_c8,&local_c8,&local_60), iVar2 != 0 ||
                (iVar2 = mbedtls_mpi_sub_mpi(&local_e0,&local_e0,&local_98), iVar2 != 0)))))) ||
             ((iVar2 = mbedtls_mpi_shift_r(&local_c8,1), iVar2 != 0 ||
              (iVar2 = mbedtls_mpi_shift_r(&local_e0,1), iVar2 != 0)))) goto LAB_0011c419;
        }
        while ((*local_f8.p & 1) == 0) {
          iVar2 = mbedtls_mpi_shift_r(&local_f8,1);
          if ((iVar2 != 0) ||
             (((((*local_110.p & 1) != 0 || ((*pbStack_68 & 1) != 0)) &&
               ((iVar2 = mbedtls_mpi_add_mpi(&local_110,&local_110,&local_60), iVar2 != 0 ||
                (iVar2 = mbedtls_mpi_sub_mpi(X_00,X_00,&local_98), iVar2 != 0)))) ||
              ((iVar2 = mbedtls_mpi_shift_r(&local_110,1), iVar2 != 0 ||
               (iVar2 = mbedtls_mpi_shift_r(X_00,1), iVar2 != 0)))))) goto LAB_0011c419;
        }
        iVar2 = mbedtls_mpi_cmp_mpi(&local_128,&local_f8);
        if (iVar2 < 0) {
          iVar2 = mbedtls_mpi_sub_mpi(&local_f8,&local_f8,&local_128);
          if ((iVar2 != 0) ||
             (iVar2 = mbedtls_mpi_sub_mpi(&local_110,&local_110,&local_c8), iVar2 != 0)) break;
          B = &local_e0;
          X_01 = X_00;
        }
        else {
          iVar2 = mbedtls_mpi_sub_mpi(&local_128,&local_128,&local_f8);
          if ((iVar2 != 0) ||
             (iVar2 = mbedtls_mpi_sub_mpi(&local_c8,&local_c8,&local_110), iVar2 != 0)) break;
          B = X_00;
          X_01 = &local_e0;
        }
        iVar2 = mbedtls_mpi_sub_mpi(X_01,X_01,B);
        if (iVar2 != 0) break;
        local_80._0_8_ = 0;
        local_b0.s = 1;
        local_b0.n = 1;
        local_b0.p = (mbedtls_mpi_uint *)local_80;
        iVar2 = mbedtls_mpi_cmp_mpi(&local_128,&local_b0);
        if (iVar2 == 0) {
          goto LAB_0011c96a;
        }
      } while( true );
    }
  }
  goto LAB_0011c419;
  while (iVar2 = mbedtls_mpi_add_mpi(&local_110,&local_110,N), iVar2 == 0) {
LAB_0011c96a:
    local_80._0_8_ = 0;
    local_b0.s = 1;
    local_b0.n = 1;
    local_b0.p = (mbedtls_mpi_uint *)local_80;
    iVar2 = mbedtls_mpi_cmp_mpi(&local_110,&local_b0);
    if (-1 < iVar2) {
      goto LAB_0011c9bf;
    }
  }
  goto LAB_0011c419;
  while (iVar2 = mbedtls_mpi_sub_mpi(&local_110,&local_110,N), iVar2 == 0) {
LAB_0011c9bf:
    iVar2 = mbedtls_mpi_cmp_mpi(&local_110,N);
    if (iVar2 < 0) {
      iVar2 = mbedtls_mpi_copy(X,&local_110);
      break;
    }
  }
LAB_0011c419:
  if (local_98.p != (mbedtls_mpi_uint *)0x0) {
    if (local_98.n != 0) {
      sVar4 = 0;
      do {
        local_98.p[sVar4] = 0;
        sVar4 = sVar4 + 1;
      } while (local_98.n != sVar4);
    }
    free(local_98.p);
  }
  local_98.s = 1;
  local_98.n = 0;
  local_98.p = (mbedtls_mpi_uint *)0x0;
  if (local_128.p != (mbedtls_mpi_uint *)0x0) {
    if (local_128.n != 0) {
      sVar4 = 0;
      do {
        local_128.p[sVar4] = 0;
        sVar4 = sVar4 + 1;
      } while (local_128.n != sVar4);
    }
    free(local_128.p);
  }
  local_128.s = 1;
  local_128.n = 0;
  local_128.p = (mbedtls_mpi_uint *)0x0;
  if (local_c8.p != (mbedtls_mpi_uint *)0x0) {
    if (local_c8.n != 0) {
      sVar4 = 0;
      do {
        local_c8.p[sVar4] = 0;
        sVar4 = sVar4 + 1;
      } while (local_c8.n != sVar4);
    }
    free(local_c8.p);
  }
  local_c8.s = 1;
  local_c8.n = 0;
  local_c8.p = (mbedtls_mpi_uint *)0x0;
  if (local_e0.p != (mbedtls_mpi_uint *)0x0) {
    if (local_e0.n != 0) {
      sVar4 = 0;
      do {
        local_e0.p[sVar4] = 0;
        sVar4 = sVar4 + 1;
      } while (local_e0.n != sVar4);
    }
    free(local_e0.p);
  }
  local_e0.s = 1;
  local_e0.n = 0;
  local_e0.p = (mbedtls_mpi_uint *)0x0;
  if (local_48.p != (mbedtls_mpi_uint *)0x0) {
    if (local_48.n != 0) {
      sVar4 = 0;
      do {
        local_48.p[sVar4] = 0;
        sVar4 = sVar4 + 1;
      } while (local_48.n != sVar4);
    }
    free(local_48.p);
  }
  local_48.s = 1;
  local_48.n = 0;
  local_48.p = (mbedtls_mpi_uint *)0x0;
  if (local_60.p != (mbedtls_mpi_uint *)0x0) {
    if (local_60.n != 0) {
      sVar4 = 0;
      do {
        local_60.p[sVar4] = 0;
        sVar4 = sVar4 + 1;
      } while (local_60.n != sVar4);
    }
    free(local_60.p);
  }
  local_60.s = 1;
  local_60.n = 0;
  local_60.p = (mbedtls_mpi_uint *)0x0;
  if (local_f8.p != (mbedtls_mpi_uint *)0x0) {
    if (local_f8.n != 0) {
      sVar4 = 0;
      do {
        local_f8.p[sVar4] = 0;
        sVar4 = sVar4 + 1;
      } while (local_f8.n != sVar4);
    }
    free(local_f8.p);
  }
  local_f8.s = 1;
  local_f8.n = 0;
  local_f8.p = (mbedtls_mpi_uint *)0x0;
  if (local_110.p != (mbedtls_mpi_uint *)0x0) {
    if (local_110.n != 0) {
      sVar4 = 0;
      do {
        local_110.p[sVar4] = 0;
        sVar4 = sVar4 + 1;
      } while (local_110.n != sVar4);
    }
    free(local_110.p);
  }
  local_110.s = 1;
  local_110.n = 0;
  local_110.p = (mbedtls_mpi_uint *)0x0;
  if (pbStack_68 != (byte *)0x0) {
    if (local_70 != (mbedtls_mpi_uint *)0x0) {
      pmVar5 = (mbedtls_mpi_uint *)0x0;
      do {
        pbVar1 = pbStack_68 + (long)pmVar5 * 8;
        pbVar1[0] = 0;
        pbVar1[1] = 0;
        pbVar1[2] = 0;
        pbVar1[3] = 0;
        pbVar1[4] = 0;
        pbVar1[5] = 0;
        pbVar1[6] = 0;
        pbVar1[7] = 0;
        pmVar5 = (mbedtls_mpi_uint *)((long)pmVar5 + 1);
      } while (local_70 != pmVar5);
    }
    free(pbStack_68);
  }
  return iVar2;
}

Assistant:

int mbedtls_mpi_inv_mod( mbedtls_mpi *X, const mbedtls_mpi *A, const mbedtls_mpi *N )
{
    int ret;
    mbedtls_mpi G, TA, TU, U1, U2, TB, TV, V1, V2;

    if( mbedtls_mpi_cmp_int( N, 1 ) <= 0 )
        return( MBEDTLS_ERR_MPI_BAD_INPUT_DATA );

    mbedtls_mpi_init( &TA ); mbedtls_mpi_init( &TU ); mbedtls_mpi_init( &U1 ); mbedtls_mpi_init( &U2 );
    mbedtls_mpi_init( &G ); mbedtls_mpi_init( &TB ); mbedtls_mpi_init( &TV );
    mbedtls_mpi_init( &V1 ); mbedtls_mpi_init( &V2 );

    MBEDTLS_MPI_CHK( mbedtls_mpi_gcd( &G, A, N ) );

    if( mbedtls_mpi_cmp_int( &G, 1 ) != 0 )
    {
        ret = MBEDTLS_ERR_MPI_NOT_ACCEPTABLE;
        goto cleanup;
    }

    MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &TA, A, N ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &TU, &TA ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &TB, N ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &TV, N ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &U1, 1 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &U2, 0 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &V1, 0 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &V2, 1 ) );

    do
    {
        while( ( TU.p[0] & 1 ) == 0 )
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &TU, 1 ) );

            if( ( U1.p[0] & 1 ) != 0 || ( U2.p[0] & 1 ) != 0 )
            {
                MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( &U1, &U1, &TB ) );
                MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &U2, &U2, &TA ) );
            }

            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &U1, 1 ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &U2, 1 ) );
        }

        while( ( TV.p[0] & 1 ) == 0 )
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &TV, 1 ) );

            if( ( V1.p[0] & 1 ) != 0 || ( V2.p[0] & 1 ) != 0 )
            {
                MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( &V1, &V1, &TB ) );
                MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &V2, &V2, &TA ) );
            }

            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &V1, 1 ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &V2, 1 ) );
        }

        if( mbedtls_mpi_cmp_mpi( &TU, &TV ) >= 0 )
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &TU, &TU, &TV ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &U1, &U1, &V1 ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &U2, &U2, &V2 ) );
        }
        else
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &TV, &TV, &TU ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &V1, &V1, &U1 ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &V2, &V2, &U2 ) );
        }
    }
    while( mbedtls_mpi_cmp_int( &TU, 0 ) != 0 );

    while( mbedtls_mpi_cmp_int( &V1, 0 ) < 0 )
        MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( &V1, &V1, N ) );

    while( mbedtls_mpi_cmp_mpi( &V1, N ) >= 0 )
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &V1, &V1, N ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( X, &V1 ) );

cleanup:

    mbedtls_mpi_free( &TA ); mbedtls_mpi_free( &TU ); mbedtls_mpi_free( &U1 ); mbedtls_mpi_free( &U2 );
    mbedtls_mpi_free( &G ); mbedtls_mpi_free( &TB ); mbedtls_mpi_free( &TV );
    mbedtls_mpi_free( &V1 ); mbedtls_mpi_free( &V2 );

    return( ret );
}